

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O2

void __thiscall QStyleOptionTitleBar::QStyleOptionTitleBar(QStyleOptionTitleBar *this)

{
  QStyleOptionTitleBar(this,1);
  return;
}

Assistant:

QStyleOptionTitleBar::QStyleOptionTitleBar()
    : QStyleOptionTitleBar(Version)
{
}